

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymObjBase::write_to_sym_file(CTcSymObjBase *this,CVmFile *fp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *buf;
  CVmFile *in_RSI;
  CTcSymObjBase *in_RDI;
  CTPNSuperclass *sc;
  size_t cnt;
  char c;
  int result;
  CVmFile *in_stack_ffffffffffffffa8;
  uint v;
  CVmFile *pCVar4;
  CVmFile *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  CTPNSuperclass *local_30;
  int local_4;
  
  if (((((*(ushort *)&in_RDI->field_0xb8 & 1) == 0) &&
       ((*(ushort *)&in_RDI->field_0xb8 >> 4 & 1) == 0)) &&
      ((*(ushort *)&in_RDI->field_0xb8 >> 2 & 1) == 0)) &&
     ((*(ushort *)&in_RDI->field_0xb8 >> 3 & 1) == 0)) {
    local_4 = CTcSymbolBase::write_to_sym_file
                        ((CTcSymbolBase *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    v = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    if ((local_4 != 0) &&
       (CVmFile::write_uint2(in_stack_ffffffffffffffb0,v), in_RDI->metaclass_ == TC_META_TADSOBJ)) {
      iVar1 = sc_is_root(in_RDI);
      uVar2 = (uint)(iVar1 != 0);
      iVar1 = is_class(in_RDI);
      uVar3 = 0;
      if (iVar1 != 0) {
        uVar3 = 2;
      }
      uVar3 = uVar2 | uVar3;
      is_transient(in_RDI);
      CVmFile::write_bytes
                ((CVmFile *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffb8,
                 (size_t)in_stack_ffffffffffffffb0);
      for (local_30 = in_RDI->sc_name_head_; local_30 != (CTPNSuperclass *)0x0;
          local_30 = local_30->nxt_) {
      }
      CVmFile::write_uint2(in_stack_ffffffffffffffb0,v);
      for (local_30 = in_RDI->sc_name_head_; local_30 != (CTPNSuperclass *)0x0;
          local_30 = local_30->nxt_) {
        pCVar4 = in_RSI;
        CTPNSuperclass::get_sym_len(local_30);
        CVmFile::write_uint2(in_stack_ffffffffffffffb0,(uint)((ulong)pCVar4 >> 0x20));
        in_stack_ffffffffffffffb0 = in_RSI;
        buf = CTPNSuperclass::get_sym_txt(local_30);
        CTPNSuperclass::get_sym_len(local_30);
        CVmFile::write_bytes((CVmFile *)CONCAT44(uVar3,uVar2),buf,(size_t)in_stack_ffffffffffffffb0)
        ;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcSymObjBase::write_to_sym_file(CVmFile *fp)
{
    int result;

    /* 
     *   If we're external, don't bother writing to the file - if we're
     *   importing an object, we don't want to export it as well.  If it's
     *   modified, don't write it either, because modified symbols cannot be
     *   referenced directly by name (the symbol for a modified object is a
     *   fake symbol anyway).  In addition, don't write the symbol if it's a
     *   'modify' or 'replace' definition that applies to an external base
     *   object - instead, we'll pick up the symbol from the other symbol
     *   file with the original definition.  
     */
    if (is_extern_ || modified_ || ext_modify_ || ext_replace_)
        return FALSE;

    /* inherit default */
    result =  CTcSymbol::write_to_sym_file(fp);

    /* if that was successful, write additional object-type-specific data */
    if (result)
    {
        /* write the metaclass ID */
        fp->write_uint2((int)metaclass_);

        /* if it's of metaclass tads-object, write superclass information */
        if (metaclass_ == TC_META_TADSOBJ)
        {
            char c;
            size_t cnt;
            CTPNSuperclass *sc;

            /* 
             *   set up our flags: indicate whether or not we're explicitly
             *   based on the root object class, and if we're a 'class'
             *   object 
             */
            c = ((sc_is_root() ? 1 : 0)
                 | (is_class() ? 2 : 0)
                 | (is_transient() ? 4 : 0));
            fp->write_bytes(&c, 1);

            /* count the declared superclasses */
            for (cnt = 0, sc = sc_name_head_ ; sc != 0 ;
                 sc = sc->nxt_, ++cnt) ;

            /* 
             *   write the number of declared superclasses followed by the
             *   names of the superclasses 
             */
            fp->write_uint2(cnt);
            for (sc = sc_name_head_ ; sc != 0 ; sc = sc->nxt_)
            {
                /* write the counted-length identifier */
                fp->write_uint2(sc->get_sym_len());
                fp->write_bytes(sc->get_sym_txt(), sc->get_sym_len());
            }
        }
    }

    /* return the result */
    return result;
}